

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void foreach_rest_unit_in_planes(AV1LrStruct *lr_ctxt,AV1_COMMON *cm,int num_planes)

{
  int in_EDX;
  long in_RSI;
  int plane;
  FilterFrameCtxt *ctxt;
  RestorationLineBuffers *in_stack_00000078;
  int32_t *in_stack_00000080;
  void *in_stack_00000088;
  rest_unit_visitor_t in_stack_00000090;
  int in_stack_0000009c;
  AV1Common *in_stack_000000a0;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    if (*(int *)(in_RSI + 0x5a20 + (long)local_24 * 0x40) != 0) {
      foreach_rest_unit_in_plane
                (in_stack_000000a0,in_stack_0000009c,in_stack_00000090,in_stack_00000088,
                 in_stack_00000080,in_stack_00000078);
    }
  }
  return;
}

Assistant:

static void foreach_rest_unit_in_planes(AV1LrStruct *lr_ctxt, AV1_COMMON *cm,
                                        int num_planes) {
  FilterFrameCtxt *ctxt = lr_ctxt->ctxt;

  for (int plane = 0; plane < num_planes; ++plane) {
    if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) {
      continue;
    }

    foreach_rest_unit_in_plane(cm, plane, lr_ctxt->on_rest_unit, &ctxt[plane],
                               cm->rst_tmpbuf, cm->rlbs);
  }
}